

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>::
insert<kj::HashMap<kj::String,int>::Entry,kj::StringPtr&>
          (HashIndex<kj::HashMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::String,_int>::Entry> table,size_t pos,char (*params) [7])

{
  uint uVar1;
  long lVar2;
  long lVar3;
  void *__s2;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar8;
  size_t __n;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar9;
  HashBucket *_s944;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar10;
  HashIndex<kj::HashMap<kj::String,_int>::Callbacks> *this_00;
  char *__s1;
  undefined8 *in_R9;
  uint uVar11;
  long lVar12;
  ArrayPtr<const_unsigned_char> s;
  Maybe<unsigned_long> MVar13;
  
  this_00 = (HashIndex<kj::HashMap<kj::String,_int>::Callbacks> *)table.ptr;
  if ((ulong)(*(long *)(this_00 + 0x18) * 2) < (*(long *)(this_00 + 8) + pos) * 3 + 3) {
    HashIndex<kj::HashMap<kj::String,_int>::Callbacks>::rehash(this_00,pos * 3 + 3);
  }
  s.size_ = in_R9[1] - 1;
  s.ptr = (uchar *)*in_R9;
  uVar5 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
  lVar2 = *(long *)(this_00 + 0x10);
  lVar3 = *(long *)(this_00 + 0x18);
  uVar11 = (int)lVar3 - 1U & uVar5;
  __s2 = (void *)*in_R9;
  sVar4 = in_R9[1];
  paVar10 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
  do {
    paVar8 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
             (lVar2 + (ulong)uVar11 * 8);
    uVar1 = *(uint *)((long)paVar8 + 4);
    if (uVar1 == 1) {
      if (paVar10 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar10 = paVar8;
      }
    }
    else {
      if (uVar1 == 0) {
        if (paVar10 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + -1;
          paVar8 = paVar10;
        }
        aVar9.value = ((ulong)uVar5 | (long)params << 0x20) + 0x200000000;
        paVar8->value = (unsigned_long)aVar9;
        *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x0;
        goto LAB_001808fc;
      }
      if (*(uint *)paVar8 == uVar5) {
        lVar7 = (ulong)(uVar1 - 2) * 0x20;
        lVar12 = *(long *)(table.size_ + 8 + lVar7);
        __n = lVar12 + (ulong)(lVar12 == 0);
        if (__n == sVar4) {
          __s1 = "";
          if (lVar12 != 0) {
            __s1 = *(char **)(lVar7 + table.size_);
          }
          iVar6 = bcmp(__s1,__s2,__n);
          if (iVar6 == 0) {
            *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x1;
            *(ulong *)(this + 8) = (ulong)(uVar1 - 2);
            aVar9 = extraout_RDX;
LAB_001808fc:
            MVar13.ptr.field_1.value = aVar9.value;
            MVar13.ptr._0_8_ = this;
            return (Maybe<unsigned_long>)MVar13.ptr;
          }
        }
      }
    }
    lVar12 = (ulong)uVar11 + 1;
    uVar11 = (uint)lVar12;
    if (lVar12 == lVar3) {
      uVar11 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }